

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O0

bool __thiscall gnilk::IPCFifoUnix::Open(IPCFifoUnix *this)

{
  bool bVar1;
  int iVar2;
  char *__path;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  path local_80;
  path local_48;
  __pid_t local_1c;
  IPCFifoUnix *pIStack_18;
  __pid_t pid;
  IPCFifoUnix *this_local;
  
  if ((this->isOpen & 1U) == 0) {
    pIStack_18 = this;
    local_1c = getpid();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_48,&this->fifoname,auto_format);
    bVar1 = std::filesystem::exists(&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
    if (bVar1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_80,&this->fifoname,auto_format);
      std::filesystem::remove(&local_80);
      std::filesystem::__cxx11::path::~path(&local_80);
    }
    std::operator+(&local_c0,&fifoBaseName_abi_cxx11_,"_");
    std::__cxx11::to_string(&local_e0,local_1c);
    std::operator+(&local_a0,&local_c0,&local_e0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->fifoname,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    __path = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->fifoname);
    iVar2 = mkfifo(__path,0x1b6);
    this->fifofd = iVar2;
    if (this->fifofd < 0) {
      perror("IPCFifoUnix::Open, mkfifo");
      this_local._7_1_ = 0;
    }
    else {
      this->isOwner = true;
      std::__cxx11::string::string((string *)&local_100,&this->fifoname);
      this_local._7_1_ = ConnectTo(this,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IPCFifoUnix::Open() {
    if (isOpen) {
        return true;
    }

    // Create name with pid - we need to be able to run multiple app's in parallel...
    auto pid = getpid();

    // if it exists - remove it - as it ought to be a left over from an old process or someone restarted the logger
    if (std::filesystem::exists(fifoname)) {
        std::filesystem::remove(fifoname);
    }

    fifoname = fifoBaseName + "_" + std::to_string(pid);

    // Create the fifo
    fifofd = mkfifo(fifoname.c_str(), 0666);
    if (fifofd < 0) {
        perror("IPCFifoUnix::Open, mkfifo");
        return false;
    }
    isOwner = true;
    return ConnectTo(fifoname);
}